

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TagExpressionParser::acceptChar(TagExpressionParser *this,char c)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,c);
  if (iVar1 != 0x2c) {
    if (iVar1 == 0x7e) {
      this->m_isNegated = true;
    }
    return;
  }
  std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::push_back
            (&this->m_exp->m_tagSets,&this->m_currentTagSet);
  return;
}

Assistant:

virtual void acceptChar( char c ) {
            switch( c ) {
                case '~':
                    m_isNegated = true;
                    break;
                case ',':
                    m_exp.m_tagSets.push_back( m_currentTagSet );
                    break;
            }
        }